

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O2

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec2i *pts,TGAColor *colors)

{
  vec<2,_int,_(glm::qualifier)0> *this_00;
  vec<2,_float,_(glm::qualifier)0> C;
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  int j;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 x;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 extraout_XMM0_Db;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar7;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar8;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 extraout_XMM0_Db_00;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar9;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 extraout_XMM0_Dc_01;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar10;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 extraout_XMM0_Dd_01;
  Vec3f VVar11;
  TGAColor c;
  Vec2i bboxmax;
  Vec2i bboxmin;
  Vec2i clamp;
  TGAColor local_a5;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_a0;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aStackY_9c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_94;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_90;
  int local_8c;
  vec<2,_float,_(glm::qualifier)0> P;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar12;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar13;
  vec<2,_float,_(glm::qualifier)0> in_stack_ffffffffffffff88;
  vec<2,_float,_(glm::qualifier)0> A;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_60;
  int local_5c;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_58;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_54;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_50;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_4c;
  undefined1 local_48 [16];
  
  iVar1 = TGAImage::get_width(*(TGAImage **)(this + 8));
  local_8c = TGAImage::get_height(*(TGAImage **)(this + 8));
  local_8c = local_8c + -1;
  _local_a0 = 0;
  local_90.x = iVar1 + -1;
  iVar1 = TGAImage::get_width(*(TGAImage **)(this + 8));
  local_5c = TGAImage::get_height(*(TGAImage **)(this + 8));
  local_5c = local_5c + -1;
  local_60.x = iVar1 + -1;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    this_00 = pts + lVar5;
    for (iVar1 = 0; iVar1 != 2; iVar1 = iVar1 + 1) {
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_90,iVar1);
      piVar3 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](this_00,iVar1);
      iVar6 = *piVar2;
      if (*piVar3 < *piVar2) {
        iVar6 = *piVar3;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_90,iVar1);
      *piVar2 = iVar6;
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_60,iVar1);
      piVar3 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_a0,iVar1);
      piVar4 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](this_00,iVar1);
      iVar6 = *piVar4;
      if (*piVar4 < *piVar3) {
        iVar6 = *piVar3;
      }
      if (*piVar2 <= iVar6) {
        iVar6 = *piVar2;
      }
      piVar2 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&local_a0,iVar1);
      *piVar2 = iVar6;
    }
  }
  A = (vec<2,_float,_(glm::qualifier)0>)this;
  TGAImage::get_width(*(TGAImage **)((long)this + 8));
  aVar8 = extraout_XMM0_Db;
  aVar9 = extraout_XMM0_Dc;
  aVar10 = extraout_XMM0_Dd;
  for (x = local_90; x.x <= local_a0.x; x.x = x.x + 1) {
    P.field_1.y = aVar8.y;
    P.field_0.x = (float)x.x;
    aVar12 = aVar9;
    aVar13 = aVar10;
    for (iVar1 = local_8c; iVar1 <= aStackY_9c.y; iVar1 = iVar1 + 1) {
      C.field_1.y = aVar13.y;
      C.field_0.x = aVar12.x;
      VVar11 = barycentric<2ul>(A,in_stack_ffffffffffffff88,C,P);
      aVar7 = VVar11.field_1;
      aVar8.y = 0.0;
      aVar9.x = 0.0;
      aVar10.y = 0.0;
      if (((0.0 <= VVar11.field_0.x) && (0.0 <= aVar7.y)) && (0.0 <= VVar11.field_2.z)) {
        local_48._8_4_ = extraout_XMM0_Dc_00;
        local_48._0_8_ = VVar11._0_8_;
        local_48._12_4_ = extraout_XMM0_Dd_00;
        local_94 = VVar11.field_2;
        local_58 = aVar7;
        aStack_54 = aVar7;
        aStack_50 = aVar7;
        aStack_4c = aVar7;
        TGAColor::TGAColor(&local_a5);
        local_a5.bgra[0] =
             (uchar)(int)((float)colors[2].bgra[0] * local_94.z +
                         (float)colors->bgra[0] * (float)local_48._0_4_ +
                         (float)colors[1].bgra[0] * local_58.y);
        local_a5.bgra[1] =
             (uchar)(int)((float)colors[2].bgra[1] * local_94.z +
                         (float)colors->bgra[1] * (float)local_48._0_4_ +
                         (float)colors[1].bgra[1] * local_58.y);
        local_a5.bgra[2] =
             (uchar)(int)((float)colors[2].bgra[2] * local_94.z +
                         (float)colors->bgra[2] * (float)local_48._0_4_ +
                         (float)colors[1].bgra[2] * local_58.y);
        TGAImage::set(*(TGAImage **)((long)this + 8),x.x,iVar1,&local_a5);
        aVar8 = extraout_XMM0_Db_00;
        aVar9 = extraout_XMM0_Dc_01;
        aVar10 = extraout_XMM0_Dd_01;
      }
    }
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec2i* pts, TGAColor* colors) {
  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  int width = mImage->get_width();

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;
      TGAColor c;
      /*
              barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];
      mImage->set(p[0], p[1], c);
    }
  }
}